

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void __thiscall duckdb::FSSTCompressionState::Reset(FSSTCompressionState *this)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  BufferHandle *this_01;
  pointer puVar1;
  pointer pCVar2;
  BufferManager *pBVar3;
  type segment;
  StringDictionaryContainer SVar4;
  data_ptr_t pdVar5;
  BufferHandle BStack_38;
  
  puVar1 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  this->current_width = '\0';
  this->max_compressed_string_length = 0;
  this->last_fitting_size = 0;
  this_00 = &this->current_segment;
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  pBVar3 = BufferManager::GetBufferManager(pCVar2->db);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  (*pBVar3->_vptr_BufferManager[7])(&BStack_38,pBVar3,&pCVar2->block);
  this_01 = &this->current_handle;
  BufferHandle::operator=(this_01,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  segment = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator*(this_00);
  SVar4 = FSSTStorage::GetDictionary(segment,this_01);
  this->current_dictionary = SVar4;
  pdVar5 = BufferHandle::Ptr(this_01);
  this->current_end_ptr = pdVar5 + (this->current_dictionary).end;
  return;
}

Assistant:

void Reset() {
		index_buffer.clear();
		current_width = 0;
		max_compressed_string_length = 0;
		last_fitting_size = 0;

		// Reset the pointers into the current segment
		auto &buffer_manager = BufferManager::GetBufferManager(current_segment->db);
		current_handle = buffer_manager.Pin(current_segment->block);
		current_dictionary = FSSTStorage::GetDictionary(*current_segment, current_handle);
		current_end_ptr = current_handle.Ptr() + current_dictionary.end;
	}